

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-ni.c
# Opt level: O1

_Bool sha1_ni_available(void)

{
  uint *puVar1;
  long lVar2;
  _Bool _Var3;
  
  _Var3 = false;
  puVar1 = (uint *)cpuid_basic_info(0);
  if (6 < *puVar1) {
    lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
    _Var3 = (_Bool)((byte)((uint)*(undefined4 *)(lVar2 + 4) >> 0x1d) & 1);
  }
  return _Var3;
}

Assistant:

static bool sha1_ni_available(void)
{
    unsigned int CPUInfo[4];
    GET_CPU_ID_0(CPUInfo);
    if (CPUInfo[0] < 7)
        return false;

    GET_CPU_ID_7(CPUInfo);
    return CPUInfo[1] & (1 << 29); /* Check SHA */
}